

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O1

void __thiscall asl::IniFile::IniFile(IniFile *this,String *fname,bool shouldwrite)

{
  Array<asl::String> *this_00;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  String *pSVar6;
  String *pSVar7;
  Dic<asl::String> *pDVar8;
  char *pcVar9;
  undefined7 in_register_00000011;
  anon_union_16_2_78e7fdac_for_String_2 *paVar10;
  long lVar11;
  long lVar12;
  int j;
  String line;
  String name;
  String value;
  TextFile file;
  String local_f0;
  String *local_d8;
  undefined4 local_cc;
  String local_c8;
  String *local_b0;
  Map<asl::String,_asl::String> *local_a8;
  anon_union_16_2_78e7fdac_for_String_2 *local_a0;
  String *local_98;
  String local_90;
  File local_78;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,shouldwrite);
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *)this,0);
  local_d8 = &this->_currentTitle;
  (this->_currentTitle).field_2._space[0] = '\0';
  (this->_currentTitle)._size = 0;
  (this->_currentTitle)._len = 0;
  local_b0 = &this->_filename;
  (this->_filename)._size = 0;
  (this->_filename)._len = 0;
  (this->_filename).field_2._space[0] = '\0';
  local_98 = &this->_indent;
  (this->_indent)._size = 0;
  (this->_indent)._len = 0;
  (this->_indent).field_2._space[0] = '\0';
  this_00 = &this->_lines;
  Array<asl::String>::alloc(this_00,0);
  this->_modified = false;
  if (fname->_size == 0) {
    paVar10 = &fname->field_2;
  }
  else {
    paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(fname->field_2)._str;
  }
  String::assign(local_b0,paVar10->_space,fname->_len);
  String::assign(local_d8,"-",1);
  this->_ok = false;
  this->_shouldwrite = SUB41(local_cc,0);
  TextFile::TextFile((TextFile *)&local_78,fname,READ);
  if (local_78._file != (FILE *)0x0) {
    Array<asl::String>::reserve(this_00,0x10);
    this->_ok = true;
    String::String(&local_f0,"-");
    local_a8 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_f0)->
                super_Map<asl::String,_asl::String>;
    if (local_f0._size != 0) {
      free(local_f0.field_2._str);
    }
    local_a0 = &(this->_currentTitle).field_2;
    do {
      bVar2 = TextFile::end((TextFile *)&local_78);
      if (bVar2) break;
      TextFile::readLine(&local_f0,(TextFile *)&local_78);
      if ((char)local_cc != '\0') {
        Array<asl::String>::insert(this_00,-1,&local_f0);
      }
      if (local_f0._len < 1) {
LAB_0013203d:
        bVar2 = false;
      }
      else {
        bVar3 = TextFile::end((TextFile *)&local_78);
        bVar2 = true;
        if (!bVar3) {
          uVar5 = &local_f0.field_2;
          if (local_f0._size != 0) {
            uVar5 = local_f0.field_2._str;
          }
          bVar1 = *(byte *)uVar5;
          paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)uVar5;
          while ((((char)bVar1 < '!' &&
                  (paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(paVar10->_space + 1),
                  bVar1 < 0x21)) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0))) {
            bVar1 = paVar10->_space[0];
          }
          if (*(byte *)uVar5 == 0x5b) {
            iVar4 = String::indexOf(&local_f0,']',1);
            if (-1 < iVar4) {
              String::substring(&local_c8,&local_f0,1,iVar4);
              local_a8 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                                    ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_c8)->
                          super_Map<asl::String,_asl::String>;
              paVar10 = local_a0;
              if (local_d8->_size != 0) {
                paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)local_a0->_str;
              }
              iVar4 = strcmp(paVar10->_space,"-");
              if (iVar4 == 0) {
                uVar5 = &local_c8.field_2;
                if (local_c8._size != 0) {
                  uVar5 = local_c8.field_2._str;
                }
                String::assign(local_d8,(char *)uVar5,local_c8._len);
              }
LAB_0013202c:
              if (local_c8._size != 0) {
                free(local_c8.field_2._str);
              }
            }
          }
          else if (bVar1 != 0x3b && '/' < (char)bVar1) {
            iVar4 = String::indexOf(&local_f0,'=',0);
            if (0 < iVar4) {
              if (((this->_indent)._len < 1) && (0 < local_f0._len)) {
                lVar11 = 0;
                do {
                  uVar5 = &local_f0.field_2;
                  if (local_f0._size != 0) {
                    uVar5 = local_f0.field_2._str;
                  }
                  bVar1 = *(byte *)(uVar5 + lVar11);
                  if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
                     ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) break;
                  String::operator+=(local_98,bVar1);
                  lVar11 = lVar11 + 1;
                } while (lVar11 < local_f0._len);
              }
              String::substring(&local_c8,&local_f0,0,iVar4);
              String::substring(&local_90,&local_f0,iVar4 + 1,local_f0._len);
              pSVar6 = String::trim(&local_90);
              pSVar7 = String::trim(&local_c8);
              pSVar7 = String::replaceme(pSVar7,'/','\\');
              pSVar7 = Map<asl::String,_asl::String>::operator[](local_a8,pSVar7);
              if (pSVar6->_size == 0) {
                paVar10 = &pSVar6->field_2;
              }
              else {
                paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar6->field_2)._str;
              }
              String::assign(pSVar7,paVar10->_space,pSVar6->_len);
              if (local_90._size != 0) {
                free(local_90.field_2._str);
              }
              goto LAB_0013202c;
            }
            iVar4 = *(int *)&this_00->_a[-1].field_2;
            if ((0 < (long)iVar4) && (0 < this_00->_a[(long)iVar4 + -1]._len)) {
              Array<asl::String>::resize(this_00,iVar4 + -1);
            }
          }
          goto LAB_0013203d;
        }
      }
      if (local_f0._size != 0) {
        free(local_f0.field_2._str);
      }
    } while (!bVar2);
    lVar11 = (long)*(int *)&this_00->_a[-1].field_2;
    lVar12 = lVar11 + 1;
    lVar11 = lVar11 * 0x18 + -0x10;
    while (lVar12 = lVar12 + -1, 1 < lVar12) {
      pSVar6 = this_00->_a;
      if (*(int *)((long)pSVar6 + lVar11 + -8) == 0) {
        pcVar9 = (char *)((long)&pSVar6->_size + lVar11);
      }
      else {
        pcVar9 = *(char **)((long)&pSVar6->_size + lVar11);
      }
      if (*pcVar9 != '\0') break;
      lVar11 = lVar11 + -0x18;
      Array<asl::String>::resize(this_00,*(int *)&pSVar6[-1].field_2 + -1);
    }
    String::String(&local_f0,"-");
    pDVar8 = Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                       ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_f0);
    iVar4 = *(int *)&(pDVar8->super_Map<asl::String,_asl::String>).a._a[-1].value.field_2;
    if (local_f0._size != 0) {
      free(local_f0.field_2._str);
    }
    if (iVar4 == 0) {
      String::String(&local_f0,"-");
      Map<asl::String,_asl::Dic<asl::String>_>::remove
                ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(char *)&local_f0);
      if (local_f0._size != 0) {
        free(local_f0.field_2._str);
      }
    }
    else {
      String::assign(local_d8,"-",1);
    }
  }
  File::~File(&local_78);
  return;
}

Assistant:

IniFile::IniFile(const String& fname, bool shouldwrite)
{
	_modified = false;
	_filename = fname;
	_currentTitle = NOSECTION;
	_ok = false;
	_shouldwrite = shouldwrite;
	TextFile file(fname, File::READ);
	if(!file) {
		return;
	}
	_lines.reserve(16);
	_ok = true;
	Section* cursection = &_sections[NOSECTION];
	while(!file.end())
	{
		String line=file.readLine();
		if (shouldwrite)
			_lines << line;
		if(!line.ok())
			continue;
		if(file.end())
			break;

		int i0 = 0;
		while (myisspace(line[i0]) && line[i0] != '\0')
			i0++;

		if (line[0] == '[')
		{
			int end = line.indexOf(']', 1);
			if(end < 0)
				continue;
			String name = line.substring(1, end);
			cursection = &_sections[name];
			if (_currentTitle == NOSECTION)
				_currentTitle = name;
		}
		else if(line[i0] != '#' && line[i0] > 47 && line[i0] != ';')
		{
			int i = line.indexOf('=');
			if (i < 1)
			{
				if (_lines.length() > 0 && _lines.last().ok())
					_lines.resize(_lines.length() - 1);
				continue;
			}
			if (!_indent.ok())
				for (int j = 0; j < line.length(); j++)
				{
					if (myisspace(line[j]))
						_indent += line[j];
					else
						break;
				}
			String key = line.substring(0,i);
			String value = line.substring(i+1);
			(*cursection)[key.trim().replaceme('/', '\\')] = value.trim();
		}
	}
	
	for(int i=_lines.length()-1; i>0 && _lines[i][0] == '\0'; i--)
	{
		_lines.resize(_lines.length()-1);
	}
	if (_sections[NOSECTION].length() == 0)
		_sections.remove(NOSECTION);
	else
		_currentTitle = NOSECTION;
}